

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O1

Matrix3d * opengv::generateRandomRotation(Matrix3d *__return_storage_ptr__,double maxAngle)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  long lVar10;
  ActualDstType actualDst;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar17 [64];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  Matrix3d R1;
  Matrix3d R2;
  undefined8 local_118;
  undefined8 uStack_110;
  double local_108 [5];
  double local_e0;
  undefined8 local_d8;
  double local_d0 [5];
  undefined1 local_a8 [16];
  undefined8 local_98;
  double local_90;
  undefined8 local_88;
  double local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  double local_38;
  double *local_30;
  undefined1 *local_28;
  double *local_20;
  undefined8 local_18;
  undefined1 extraout_var [56];
  
  iVar8 = rand();
  local_118 = (double)iVar8 / 2147483647.0;
  iVar8 = rand();
  iVar9 = rand();
  dVar18 = maxAngle + maxAngle;
  local_118 = dVar18 * (local_118 + -0.5);
  dVar13 = dVar18 * ((double)iVar8 / 2147483647.0 + -0.5);
  dVar18 = dVar18 * ((double)iVar9 / 2147483647.0 + -0.5);
  local_108[3] = 0.0;
  local_d8 = 0;
  local_108[0] = 1.0;
  local_108[1] = 0.0;
  local_108[4] = cos(local_118);
  local_e0 = sin(local_118);
  local_118 = -0.0;
  uStack_110 = 0x8000000000000000;
  auVar11._0_8_ = -local_e0;
  auVar11._8_4_ = (int)extraout_XMM0_Qb;
  auVar11._12_4_ = (uint)((ulong)extraout_XMM0_Qb >> 0x20) ^ 0x80000000;
  local_d0[0] = (double)vmovlps_avx(auVar11);
  local_108[2] = 0.0;
  local_d0[1] = local_108[4];
  local_d0[2] = cos(dVar13);
  local_90 = sin(dVar13);
  local_d0[3] = 0.0;
  local_a8 = vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  local_88 = 0;
  auVar14._0_4_ = SUB84(local_90,0) ^ (uint)local_118;
  auVar14._4_4_ = (uint)((ulong)local_90 >> 0x20) ^ local_118._4_4_;
  auVar14._8_4_ = (uint)extraout_XMM0_Qb_00 ^ (uint)uStack_110;
  auVar14._12_4_ = (uint)((ulong)extraout_XMM0_Qb_00 >> 0x20) ^ uStack_110._4_4_;
  local_d0[4] = (double)vmovlps_avx(auVar14);
  local_98 = 0;
  local_80 = local_d0[2];
  dVar13 = cos(dVar18);
  auVar17._0_8_ = sin(dVar18);
  auVar17._8_56_ = extraout_var;
  auVar19._0_8_ = (ulong)auVar17._0_8_ ^ (ulong)local_118;
  auVar19._8_8_ = extraout_var._0_8_ ^ uStack_110;
  auVar12._8_8_ = extraout_XMM0_Qb_01;
  auVar12._0_8_ = dVar13;
  auVar14 = vunpcklpd_avx(auVar12,auVar17._0_16_);
  auVar12 = vunpcklpd_avx(auVar19,auVar12);
  lVar10 = 0x10;
  do {
    dVar18 = *(double *)((long)local_d0 + lVar10 + 0x10);
    auVar23._8_8_ = dVar18;
    auVar23._0_8_ = dVar18;
    auVar2._8_8_ = *(undefined8 *)((long)local_d0 + lVar10);
    auVar2._0_8_ = *(undefined8 *)((long)local_d0 + lVar10);
    auVar11 = vmulpd_avx512vl(auVar14,auVar2);
    uVar1 = *(undefined8 *)((long)local_d0 + lVar10 + 8);
    auVar3._8_8_ = uVar1;
    auVar3._0_8_ = uVar1;
    auVar11 = vfmadd231pd_avx512vl(auVar11,auVar12,auVar3);
    auVar11 = vfmadd231pd_fma(auVar11,auVar23,ZEXT816(0) << 0x40);
    *(undefined1 (*) [16])((long)&local_88 + lVar10) = auVar11;
    auVar27._0_8_ = *(double *)((long)local_d0 + lVar10) * 0.0;
    auVar27._8_8_ = *(double *)((long)local_d0 + lVar10 + 8) * 0.0;
    auVar11 = vshufpd_avx(auVar27,auVar27,1);
    *(double *)(local_78 + lVar10) = auVar27._0_8_ + auVar11._0_8_ + dVar18;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x58);
  local_30 = local_108;
  local_28 = local_78;
  local_20 = local_108;
  local_18 = 3;
  auVar6._8_8_ = uStack_60;
  auVar6._0_8_ = local_68;
  auVar7._8_8_ = uStack_58;
  auVar7._0_8_ = uStack_60;
  auVar14 = vmovhpd_avx(auVar6,local_50);
  lVar10 = 0x10;
  do {
    dVar18 = *(double *)((long)local_108 + lVar10);
    auVar36._8_8_ = dVar18;
    auVar36._0_8_ = dVar18;
    auVar4._8_8_ = *(undefined8 *)((long)&local_118 + lVar10);
    auVar4._0_8_ = *(undefined8 *)((long)&local_118 + lVar10);
    auVar12 = vmulpd_avx512vl(local_78,auVar4);
    auVar5._8_8_ = *(undefined8 *)((long)&uStack_110 + lVar10);
    auVar5._0_8_ = *(undefined8 *)((long)&uStack_110 + lVar10);
    auVar12 = vfmadd231pd_avx512vl(auVar12,auVar7,auVar5);
    auVar12 = vfmadd231pd_fma(auVar12,local_48,auVar36);
    auVar41._0_8_ = auVar14._0_8_ * *(double *)((long)&local_118 + lVar10);
    auVar41._8_8_ = auVar14._8_8_ * *(double *)((long)&uStack_110 + lVar10);
    *(undefined1 (*) [16])
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array + lVar10 + -0x10) = auVar12;
    auVar12 = vshufpd_avx(auVar41,auVar41,1);
    *(double *)
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array + lVar10) = auVar41._0_8_ + auVar12._0_8_ + local_38 * dVar18;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x58);
  auVar14 = *(undefined1 (*) [16])
             (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
             m_storage.m_data.array;
  dVar18 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array[2];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar18 * dVar18 + auVar14._0_8_ * auVar14._0_8_ + auVar14._8_8_ * auVar14._8_8_;
  auVar12 = vsqrtpd_avx(auVar20);
  dVar13 = auVar12._0_8_;
  auVar28._8_8_ = dVar13;
  auVar28._0_8_ = dVar13;
  auVar14 = vdivpd_avx(auVar14,auVar28);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
   m_data.array = auVar14;
  auVar15._0_8_ = dVar18 / dVar13;
  auVar15._8_8_ = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = auVar15._0_8_;
  dVar18 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar18;
  dVar13 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array[1];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar13;
  dVar26 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array[3];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar26;
  auVar14 = *(undefined1 (*) [16])
             ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
              .m_storage.m_data.array + 4);
  auVar12 = vunpcklpd_avx(auVar15,auVar21);
  auVar37._0_8_ = auVar14._0_8_ * auVar12._0_8_;
  auVar37._8_8_ = auVar14._8_8_ * auVar12._8_8_;
  auVar12 = vunpcklpd_avx(auVar24,auVar15);
  dVar33 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array[5];
  auVar42._8_8_ = dVar33;
  auVar42._0_8_ = dVar33;
  auVar11 = vunpcklpd_avx(auVar42,auVar29);
  auVar12 = vfmsub213pd_fma(auVar11,auVar12,auVar37);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar26 * dVar13;
  auVar11 = vfmsub231sd_fma(auVar30,auVar21,auVar14);
  dVar26 = auVar11._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar26 * dVar26 + auVar12._0_8_ * auVar12._0_8_ + auVar12._8_8_ * auVar12._8_8_;
  auVar14 = vsqrtpd_avx(auVar34);
  dVar33 = auVar14._0_8_;
  auVar38._8_8_ = dVar33;
  auVar38._0_8_ = dVar33;
  auVar14 = vdivpd_avx(auVar12,auVar38);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array + 6) = auVar14;
  auVar31._0_8_ = dVar26 / dVar33;
  auVar31._8_8_ = auVar11._8_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] = auVar31._0_8_;
  dVar26 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array[6];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar26;
  dVar33 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array[7];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar33;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar13 * auVar31._0_8_;
  auVar14 = vfmsub231sd_fma(auVar40,auVar39,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar15._0_8_ * dVar26;
  auVar12 = vfmsub231sd_fma(auVar16,auVar21,auVar31);
  auVar12 = vunpcklpd_avx(auVar14,auVar12);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar18 * dVar33;
  auVar14 = vfmsub231sd_fma(auVar22,auVar35,auVar24);
  dVar18 = auVar14._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar18 * dVar18 + auVar12._0_8_ * auVar12._0_8_ + auVar12._8_8_ * auVar12._8_8_;
  auVar14 = vsqrtpd_avx(auVar25);
  dVar13 = auVar14._0_8_;
  auVar32._8_8_ = dVar13;
  auVar32._0_8_ = dVar13;
  auVar14 = vdivpd_avx(auVar12,auVar32);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array + 3) = auVar14;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] = dVar18 / dVar13;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d
opengv::generateRandomRotation( double maxAngle )
{
  Eigen::Vector3d rpy;
  rpy[0] = ((double) rand())/ ((double) RAND_MAX);
  rpy[1] = ((double) rand())/ ((double) RAND_MAX);
  rpy[2] = ((double) rand())/ ((double) RAND_MAX);

  rpy[0] = maxAngle*2.0*(rpy[0]-0.5);
  rpy[1] = maxAngle*2.0*(rpy[1]-0.5);
  rpy[2] = maxAngle*2.0*(rpy[2]-0.5);

  Matrix3d R1;
  R1(0,0) = 1.0;
  R1(0,1) = 0.0;
  R1(0,2) = 0.0;
  R1(1,0) = 0.0;
  R1(1,1) = cos(rpy[0]);
  R1(1,2) = -sin(rpy[0]);
  R1(2,0) = 0.0;
  R1(2,1) = -R1(1,2);
  R1(2,2) = R1(1,1);

  Matrix3d R2;
  R2(0,0) = cos(rpy[1]);
  R2(0,1) = 0.0;
  R2(0,2) = sin(rpy[1]);
  R2(1,0) = 0.0;
  R2(1,1) = 1.0;
  R2(1,2) = 0.0;
  R2(2,0) = -R2(0,2);
  R2(2,1) = 0.0;
  R2(2,2) = R2(0,0);

  Matrix3d R3;
  R3(0,0) = cos(rpy[2]);
  R3(0,1) = -sin(rpy[2]);
  R3(0,2) = 0.0;
  R3(1,0) =-R3(0,1);
  R3(1,1) = R3(0,0);
  R3(1,2) = 0.0;
  R3(2,0) = 0.0;
  R3(2,1) = 0.0;
  R3(2,2) = 1.0;

  Matrix3d rotation = R3 * R2 * R1;

  rotation.col(0) = rotation.col(0) / rotation.col(0).norm();
  rotation.col(2) = rotation.col(0).cross(rotation.col(1));
  rotation.col(2) = rotation.col(2) / rotation.col(2).norm();
  rotation.col(1) = rotation.col(2).cross(rotation.col(0));
  rotation.col(1) = rotation.col(1) / rotation.col(1).norm();

  return rotation;
}